

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

void __thiscall
icu_63::CollationRuleParser::setParseError
          (CollationRuleParser *this,char *reason,UErrorCode *errorCode)

{
  UBool UVar1;
  UErrorCode *errorCode_local;
  char *reason_local;
  CollationRuleParser *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    *errorCode = U_INVALID_FORMAT_ERROR;
    this->errorReason = reason;
    if (this->parseError != (UParseError *)0x0) {
      setErrorContext(this);
    }
  }
  return;
}

Assistant:

void
CollationRuleParser::setParseError(const char *reason, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    // Error code consistent with the old parser (from ca. 2001),
    // rather than U_PARSE_ERROR;
    errorCode = U_INVALID_FORMAT_ERROR;
    errorReason = reason;
    if(parseError != NULL) { setErrorContext(); }
}